

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::CloseConnection(SocketWriter *this)

{
  ostream *poVar1;
  int __fd;
  GTestLog local_14;
  
  __fd = this->sockfd_;
  if (__fd == -1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x461);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar1,"CloseConnection() can be called only when there is a connection.");
    GTestLog::~GTestLog(&local_14);
    __fd = this->sockfd_;
  }
  close(__fd);
  this->sockfd_ = -1;
  return;
}

Assistant:

void CloseConnection() override {
      GTEST_CHECK_(sockfd_ != -1)
          << "CloseConnection() can be called only when there is a connection.";

      close(sockfd_);
      sockfd_ = -1;
    }